

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_paramtype.cc
# Opt level: O2

void __thiscall
ParameterizedType::DoGenParseCode
          (ParameterizedType *this,Output *out_cc,Env *env,DataPtr *data,int flags)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  Type *this_00;
  char *pcVar4;
  ID *pIVar5;
  undefined4 in_register_00000084;
  char *pcVar6;
  string call_parse_func;
  string parse_params;
  
  if (FLAGS_pac_debug) {
    fprintf(_stderr,"DoGenParseCode for %s\n",(this->type_id_->name)._M_dataplus._M_p,data,
            CONCAT44(in_register_00000084,flags));
  }
  this_00 = ReferredDataType(this,true);
  parse_params._M_dataplus._M_p = (pointer)&parse_params.field_2;
  parse_params._M_string_length = 0;
  parse_params.field_2._M_local_buf[0] = '\0';
  iVar3 = (*(this->super_Type).super_DataDepElement._vptr_DataDepElement[0x16])(this);
  pcVar6 = "Parse";
  if (iVar3 == 1) {
    std::__cxx11::string::assign((char *)&parse_params);
  }
  else if (this_00->incremental_input_ == true) {
    Env::RValue(env,flow_buffer_id);
    std::__cxx11::string::assign((char *)&parse_params);
    pcVar6 = "ParseBuffer";
  }
  else {
    pcVar1 = (data->ptr_expr_)._M_dataplus._M_p;
    pcVar4 = Env::RValue(env,end_of_data);
    strfmt_abi_cxx11_(&call_parse_func,"%s, %s",pcVar1,pcVar4);
    std::__cxx11::string::operator=((string *)&parse_params,(string *)&call_parse_func);
    std::__cxx11::string::~string((string *)&call_parse_func);
  }
  bVar2 = ::RequiresAnalyzerContext::compute(&this_00->super_DataDepElement);
  if (bVar2) {
    pcVar4 = Env::RValue(env,analyzer_context_id);
    strfmt_abi_cxx11_(&call_parse_func,", %s",pcVar4);
    std::__cxx11::string::append((string *)&parse_params);
    std::__cxx11::string::~string((string *)&call_parse_func);
  }
  bVar2 = Type::RequiresByteOrder(this_00);
  if (bVar2) {
    Env::Evaluate(env,out_cc,byteorder_id);
    pcVar4 = Env::RValue(env,byteorder_id);
    strfmt_abi_cxx11_(&call_parse_func,", %s",pcVar4);
    std::__cxx11::string::append((string *)&parse_params);
    std::__cxx11::string::~string((string *)&call_parse_func);
  }
  strfmt_abi_cxx11_(&call_parse_func,"%s->%s(%s)",(this->super_Type).lvalue_._M_dataplus._M_p,pcVar6
                    ,parse_params._M_dataplus._M_p);
  if ((this->super_Type).incremental_input_ == true) {
    iVar3 = (*(this->super_Type).super_DataDepElement._vptr_DataDepElement[0x16])(this);
    if (iVar3 != 1) {
      pIVar5 = Type::parsing_complete_var(&this->super_Type);
      pcVar6 = Env::LValue(env,pIVar5);
      Output::println(out_cc,"%s = %s;",pcVar6,call_parse_func._M_dataplus._M_p);
      pIVar5 = Type::parsing_complete_var(&this->super_Type);
      bVar2 = Env::Evaluated(env,pIVar5);
      if (bVar2) goto LAB_0011ea79;
      pIVar5 = Type::parsing_complete_var(&this->super_Type);
LAB_0011ea53:
      Env::SetEvaluated(env,pIVar5,true);
      goto LAB_0011ea79;
    }
    Output::println(out_cc,"%s;",call_parse_func._M_dataplus._M_p);
    pIVar5 = Type::parsing_complete_var(&this->super_Type);
    call_parse_func._M_dataplus._M_p = Env::LValue(env,pIVar5);
    pcVar6 = "%s = true;";
  }
  else {
    bVar2 = Type::AddSizeVar(&this->super_Type,out_cc,env);
    if (bVar2) {
      pIVar5 = Type::size_var(&this->super_Type);
      pcVar6 = Env::LValue(env,pIVar5);
      Output::println(out_cc,"%s = %s;",pcVar6,call_parse_func._M_dataplus._M_p);
      pIVar5 = Type::size_var(&this->super_Type);
      goto LAB_0011ea53;
    }
    pcVar6 = "%s;";
  }
  Output::println(out_cc,pcVar6,call_parse_func._M_dataplus._M_p);
LAB_0011ea79:
  std::__cxx11::string::~string((string *)&call_parse_func);
  std::__cxx11::string::~string((string *)&parse_params);
  return;
}

Assistant:

void ParameterizedType::DoGenParseCode(Output* out_cc, Env* env, const DataPtr& data, int flags)
	{
	DEBUG_MSG("DoGenParseCode for %s\n", type_id_->Name());

	Type* ref_type = ReferredDataType(true);

	const char* parse_func;
	string parse_params;

	if ( buffer_mode() == BUFFER_NOTHING )
		{
		ASSERT(! ref_type->incremental_input());
		parse_func = kParseFuncWithoutBuffer;
		parse_params = "nullptr, nullptr";
		}
	else if ( ref_type->incremental_input() )
		{
		parse_func = kParseFuncWithBuffer;
		parse_params = env->RValue(flow_buffer_id);
		}
	else
		{
		parse_func = kParseFuncWithoutBuffer;
		parse_params = strfmt("%s, %s", data.ptr_expr(), env->RValue(end_of_data));
		}

	if ( RequiresAnalyzerContext::compute(ref_type) )
		{
		parse_params += strfmt(", %s", env->RValue(analyzer_context_id));
		}

	if ( ref_type->RequiresByteOrder() )
		{
		env->Evaluate(out_cc, byteorder_id);
		parse_params += strfmt(", %s", env->RValue(byteorder_id));
		}

	string call_parse_func = strfmt("%s->%s(%s)",
	                                lvalue(), // parse() needs an LValue
	                                parse_func, parse_params.c_str());

	if ( incremental_input() )
		{
		if ( buffer_mode() == BUFFER_NOTHING )
			{
			out_cc->println("%s;", call_parse_func.c_str());
			out_cc->println("%s = true;", env->LValue(parsing_complete_var()));
			}
		else
			{
			ASSERT(parsing_complete_var());
			out_cc->println("%s = %s;", env->LValue(parsing_complete_var()),
			                call_parse_func.c_str());

			// parsing_complete_var might have been already
			// evaluated when set to false
			if ( ! env->Evaluated(parsing_complete_var()) )
				env->SetEvaluated(parsing_complete_var());
			}
		}
	else
		{
		if ( AddSizeVar(out_cc, env) )
			{
			out_cc->println("%s = %s;", env->LValue(size_var()), call_parse_func.c_str());
			env->SetEvaluated(size_var());
			}
		else
			{
			out_cc->println("%s;", call_parse_func.c_str());
			}
		}
	}